

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.cpp
# Opt level: O3

string * __thiscall helics::FilterInfo::getDestinationEndpoints_abi_cxx11_(FilterInfo *this)

{
  string *this_00;
  pointer pEVar1;
  pointer pEVar2;
  string_t local_60;
  data local_40;
  
  this_00 = &this->destEpts;
  if ((this->destEpts)._M_string_length == 0) {
    pEVar2 = (this->destEndpoints).
             super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar1 = (this->destEndpoints).
             super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pEVar2 != pEVar1) {
      if ((long)pEVar1 - (long)pEVar2 == 0x48) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar2->key)
        ;
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,'[');
        pEVar2 = (this->destEndpoints).
                 super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pEVar1 = (this->destEndpoints).
                 super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pEVar2 != pEVar1) {
          do {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pEVar2->key);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::dump(&local_60,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_40,-1,' ',true,hex);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_40);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                      local_60._M_dataplus._M_p,local_60._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                      ',');
            pEVar2 = pEVar2 + 1;
          } while (pEVar2 != pEVar1);
        }
        (this->destEpts)._M_dataplus._M_p[(this->destEpts)._M_string_length - 1] = ']';
      }
    }
  }
  return this_00;
}

Assistant:

const std::string& FilterInfo::getDestinationEndpoints() const
{
    if (destEpts.empty()) {
        if (!destEndpoints.empty()) {
            if (destEndpoints.size() == 1) {
                destEpts = destEndpoints.front().key;
            } else {
                destEpts.push_back('[');
                for (const auto& trgt : destEndpoints) {
                    destEpts.append(generateJsonQuotedString(trgt.key));
                    destEpts.push_back(',');
                }
                destEpts.back() = ']';
            }
        }
    }
    return destEpts;
}